

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_sine_c++.cpp
# Opt level: O0

int __thiscall Sine::open(Sine *this,char *__file,int __oflag,...)

{
  uint uVar1;
  PaDeviceInfo *pPVar2;
  Sine *pSVar3;
  PaError err;
  PaDeviceInfo *pInfo;
  PaStreamParameters outputParameters;
  PaDeviceIndex index_local;
  Sine *this_local;
  
  pInfo._0_4_ = (int)__file;
  if ((int)pInfo == -1) {
    this_local._7_1_ = 0;
    pSVar3 = (Sine *)((ulong)__file & 0xffffffff);
  }
  else {
    outputParameters.hostApiSpecificStreamInfo._4_4_ = (int)pInfo;
    pPVar2 = Pa_GetDeviceInfo((int)pInfo);
    if (pPVar2 != (PaDeviceInfo *)0x0) {
      printf("Output device name: \'%s\'\r",pPVar2->name);
    }
    pInfo._4_4_ = 2;
    outputParameters.device = 1;
    outputParameters.channelCount = 0;
    pPVar2 = Pa_GetDeviceInfo((int)pInfo);
    outputParameters.sampleFormat = (PaSampleFormat)pPVar2->defaultLowOutputLatency;
    outputParameters.suggestedLatency = 0.0;
    uVar1 = Pa_OpenStream(&this->stream,(PaStreamParameters *)0x0,(PaStreamParameters *)&pInfo,
                          44100.0,0,1,paCallback,this);
    if (uVar1 == 0) {
      uVar1 = Pa_SetStreamFinishedCallback(this->stream,paStreamFinished);
      pSVar3 = (Sine *)(ulong)uVar1;
      if (uVar1 == 0) {
        this_local._7_1_ = 1;
      }
      else {
        Pa_CloseStream(this->stream);
        this->stream = (PaStream *)0x0;
        this_local._7_1_ = 0;
        pSVar3 = this;
      }
    }
    else {
      this_local._7_1_ = 0;
      pSVar3 = (Sine *)(ulong)uVar1;
    }
  }
  return (int)CONCAT71((int7)((ulong)pSVar3 >> 8),this_local._7_1_);
}

Assistant:

bool open(PaDeviceIndex index)
    {
        PaStreamParameters outputParameters;

        outputParameters.device = index;
        if (outputParameters.device == paNoDevice) {
            return false;
        }

        const PaDeviceInfo* pInfo = Pa_GetDeviceInfo(index);
        if (pInfo != 0)
        {
            printf("Output device name: '%s'\r", pInfo->name);
        }

        outputParameters.channelCount = 2;       /* stereo output */
        outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
        outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
        outputParameters.hostApiSpecificStreamInfo = NULL;

        PaError err = Pa_OpenStream(
            &stream,
            NULL, /* no input */
            &outputParameters,
            SAMPLE_RATE,
            paFramesPerBufferUnspecified,
            paClipOff,      /* we won't output out of range samples so don't bother clipping them */
            &Sine::paCallback,
            this            /* Using 'this' for userData so we can cast to Sine* in paCallback method */
            );

        if (err != paNoError)
        {
            /* Failed to open stream to device !!! */
            return false;
        }

        err = Pa_SetStreamFinishedCallback( stream, &Sine::paStreamFinished );

        if (err != paNoError)
        {
            Pa_CloseStream( stream );
            stream = 0;

            return false;
        }

        return true;
    }